

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall SQCompilation::CodegenVisitor::visitCallExpr(CodegenVisitor *this,CallExpr *call)

{
  bool bVar1;
  bool bVar2;
  TreeOp TVar3;
  size_type_conflict sVar4;
  Node *this_00;
  GetFieldExpr *this_01;
  ArenaVector<SQCompilation::Expr_*> *this_02;
  const_iterator ppEVar5;
  SQInteger arg1;
  SQInteger arg2;
  SQInteger arg3;
  CallExpr *in_RSI;
  SQInteger *in_RDI;
  SQInteger target;
  SQInteger closure;
  SQInteger stackbase;
  SQUnsignedInteger i;
  Expr *arg;
  const_iterator __end1;
  const_iterator __begin1;
  ArenaVector<SQCompilation::Expr_*> *__range1;
  ArenaVector<SQCompilation::Expr_*> *args;
  SQInteger ttarget_1;
  SQInteger src;
  SQInteger key_1;
  SQInteger flags;
  SQInteger storedSelf;
  SQInteger self;
  SQInteger ttarget;
  SQInteger closure_1;
  SQInteger table;
  SQInteger key;
  SQInteger outerPos;
  bool isTypeMethod;
  bool isNullCall;
  Expr *callee;
  Node *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  SQFuncState *in_stack_fffffffffffffef8;
  SQFuncState *in_stack_ffffffffffffff00;
  SQInteger in_stack_ffffffffffffff08;
  SQInteger in_stack_ffffffffffffff10;
  ulong arg0;
  SQInteger in_stack_ffffffffffffff18;
  SQOpcode _op;
  SQFuncState *in_stack_ffffffffffffff20;
  Expr *in_stack_ffffffffffffff40;
  SQFuncState *in_stack_ffffffffffffff48;
  ulong local_a8;
  const_iterator local_90;
  bool local_1a;
  
  maybeAddInExprLine((CodegenVisitor *)in_stack_ffffffffffffff00,(Expr *)in_stack_fffffffffffffef8);
  CallExpr::callee(in_RSI);
  this_00 = &deparen((CodegenVisitor *)in_stack_fffffffffffffef8,
                     (Expr *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))->
             super_Node;
  bVar1 = CallExpr::isNullable(in_RSI);
  local_1a = false;
  TVar3 = Node::op(this_00);
  if (TVar3 == TO_GETFIELD) {
    this_01 = Node::asGetField(this_00);
    local_1a = GetFieldExpr::isTypeMethod(this_01);
  }
  visitNoGet((CodegenVisitor *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8);
  bVar2 = isCalleeAnObject((Expr *)in_stack_fffffffffffffee8);
  if (bVar2) {
    if (((bVar1) || (local_1a != false)) || ((*(ulong *)in_RDI[1] & 0x800) != 0)) {
      SQFuncState::GetUpTarget
                ((SQFuncState *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (SQInteger)in_stack_fffffffffffffee8);
      SQFuncState::PushTarget
                (in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      SQFuncState::AddInstruction
                (in_stack_ffffffffffffff20,(SQOpcode)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8);
      SQFuncState::PopTarget(in_stack_ffffffffffffff00);
      SQFuncState::PopTarget(in_stack_ffffffffffffff00);
      SQFuncState::PopTarget(in_stack_ffffffffffffff00);
      SQFuncState::PushTarget
                (in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      SQFuncState::AddInstruction
                (in_stack_ffffffffffffff20,(SQOpcode)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8);
      SQFuncState::PushTarget
                (in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      SQFuncState::AddInstruction
                (in_stack_ffffffffffffff20,(SQOpcode)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8);
    }
    else {
      SQFuncState::PopTarget(in_stack_ffffffffffffff00);
      SQFuncState::PopTarget(in_stack_ffffffffffffff00);
      SQFuncState::PushTarget
                (in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      SQFuncState::PushTarget
                (in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      SQFuncState::AddInstruction
                (in_stack_ffffffffffffff20,(SQOpcode)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8);
    }
  }
  else {
    bVar1 = isCalleeAnOuter(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_RDI);
    if (bVar1) {
      in_stack_ffffffffffffff20 = (SQFuncState *)in_RDI[1];
      SQFuncState::PushTarget
                (in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      SQFuncState::AddInstruction
                (in_stack_ffffffffffffff20,(SQOpcode)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8);
      SQFuncState::PushTarget
                (in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      SQFuncState::AddInstruction
                (in_stack_ffffffffffffff20,(SQOpcode)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8);
    }
    else {
      in_stack_ffffffffffffff18 = in_RDI[1];
      SQFuncState::PushTarget
                (in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      SQFuncState::AddInstruction
                (in_stack_ffffffffffffff20,(SQOpcode)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8);
    }
  }
  this_02 = CallExpr::arguments(in_RSI);
  local_90 = ArenaVector<SQCompilation::Expr_*>::begin(this_02);
  ppEVar5 = ArenaVector<SQCompilation::Expr_*>::end(this_02);
  for (; local_90 != ppEVar5; local_90 = local_90 + 1) {
    Node::visit<SQCompilation::CodegenVisitor>
              ((Node *)in_stack_ffffffffffffff00,(CodegenVisitor *)in_stack_fffffffffffffef8);
    MoveIfCurrentTargetIsLocal((CodegenVisitor *)in_stack_ffffffffffffff00);
  }
  local_a8 = 0;
  while( true ) {
    arg0 = local_a8;
    sVar4 = ArenaVector<SQCompilation::Expr_*>::size(this_02);
    _op = (SQOpcode)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    if (sVar4 <= arg0) break;
    SQFuncState::PopTarget(in_stack_ffffffffffffff00);
    local_a8 = local_a8 + 1;
  }
  arg1 = SQFuncState::PopTarget(in_stack_ffffffffffffff00);
  arg2 = SQFuncState::PopTarget(in_stack_ffffffffffffff00);
  arg3 = SQFuncState::PushTarget
                   (in_stack_fffffffffffffef8,
                    CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  ArenaVector<SQCompilation::Expr_*>::size(this_02);
  SQFuncState::AddInstruction(in_stack_ffffffffffffff20,_op,arg0,arg1,arg2,arg3);
  return;
}

Assistant:

void CodegenVisitor::visitCallExpr(CallExpr *call) {
    maybeAddInExprLine(call);

    Expr *callee = deparen(call->callee());
    bool isNullCall = call->isNullable();
    bool isTypeMethod = false;
    if (callee->op() == TO_GETFIELD) {
        isTypeMethod = callee->asGetField()->isTypeMethod();
    }

    visitNoGet(callee);

    SQInteger outerPos = -1;

    if (isCalleeAnObject(callee)) {
        if (!isNullCall && !isTypeMethod && ((_fs->lang_features & LF_FORBID_IMPLICIT_DEF_DELEGATE) == 0)) {
            SQInteger key = _fs->PopTarget();  /* location of the key */
            SQInteger table = _fs->PopTarget();  /* location of the object */
            SQInteger closure = _fs->PushTarget(); /* location for the closure */
            SQInteger ttarget = _fs->PushTarget(); /* location for 'this' pointer */
            _fs->AddInstruction(_OP_PREPCALL, closure, key, table, ttarget);
        }
        else {
            SQInteger self = _fs->GetUpTarget(1);  /* location of the object */
            SQInteger storedSelf = _fs->PushTarget();
            _fs->AddInstruction(_OP_MOVE, storedSelf, self);
            _fs->PopTarget();
            SQInteger flags = 0;
            if (isTypeMethod) {
                flags |= OP_GET_FLAG_TYPE_METHODS_ONLY;
            } else if ((_fs->lang_features & LF_FORBID_IMPLICIT_DEF_DELEGATE) == 0) {
                flags |= OP_GET_FLAG_ALLOW_DEF_DELEGATE;
            }
            if (isNullCall)
              flags |= OP_GET_FLAG_NO_ERROR;

            SQInteger key = _fs->PopTarget();
            SQInteger src = _fs->PopTarget();
            _fs->AddInstruction(_OP_GET, _fs->PushTarget(), key, src, flags);
            SQInteger ttarget = _fs->PushTarget();
            _fs->AddInstruction(_OP_MOVE, ttarget, storedSelf);
        }
    }
    else if (isCalleeAnOuter(_fs, callee, outerPos)) {
        _fs->AddInstruction(_OP_GETOUTER, _fs->PushTarget(), outerPos);
        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
    }
    else {
        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
    }

    const auto &args = call->arguments();

    for (auto arg : args) {
        arg->visit(this);
        MoveIfCurrentTargetIsLocal();
    }

    for (SQUnsignedInteger i = 0; i < args.size(); ++i) {
        _fs->PopTarget();
    }

    SQInteger stackbase = _fs->PopTarget();
    SQInteger closure = _fs->PopTarget();
    SQInteger target = _fs->PushTarget();
    assert(target >= -1);
    assert(target < 255);
    _fs->AddInstruction(isNullCall ? _OP_NULLCALL : _OP_CALL, target, closure, stackbase, args.size() + 1);
}